

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O1

int run_command(char **output,char *command,...)

{
  byte bVar1;
  char in_AL;
  uint uVar2;
  size_t sVar3;
  FILE *__stream;
  char *pcVar4;
  ushort **ppuVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char command_buf [8192];
  undefined8 local_40f8;
  void **local_40f0;
  undefined1 *local_40e8;
  undefined1 local_40d8 [16];
  undefined8 local_40c8;
  undefined8 local_40c0;
  undefined8 local_40b8;
  undefined8 local_40b0;
  undefined8 local_40a8;
  undefined8 local_4098;
  undefined8 local_4088;
  undefined8 local_4078;
  undefined8 local_4068;
  undefined8 local_4058;
  undefined8 local_4048;
  undefined8 local_4038;
  char acStack_4029 [8193];
  char local_2028 [8192];
  
  local_40e8 = local_40d8;
  if (in_AL != '\0') {
    local_40a8 = in_XMM0_Qa;
    local_4098 = in_XMM1_Qa;
    local_4088 = in_XMM2_Qa;
    local_4078 = in_XMM3_Qa;
    local_4068 = in_XMM4_Qa;
    local_4058 = in_XMM5_Qa;
    local_4048 = in_XMM6_Qa;
    local_4038 = in_XMM7_Qa;
  }
  local_40f0 = &args[0].overflow_arg_area;
  local_40f8 = 0x3000000010;
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  local_40c8 = in_RDX;
  local_40c0 = in_RCX;
  local_40b8 = in_R8;
  local_40b0 = in_R9;
  uVar2 = vsnprintf(local_2028,0x2000,command,&local_40f8);
  if (uVar2 < 0x2000) {
    sVar3 = strlen(local_2028);
    if ((sVar3 - 0x1ff9 < 0xffffffffffffe000) ||
       (uVar2 = snprintf(acStack_4029 + 1,0x2000,"%s 2>&1",local_2028), 0x1fff < uVar2)) {
      pcVar4 = "Unable to rewrite command (%s)\n";
    }
    else {
      fprintf(_stdout,"Command: %s\n",local_2028);
      __stream = popen(acStack_4029 + 1,"r");
      if (__stream != (FILE *)0x0) {
        acStack_4029[1] = 0;
        sVar3 = 0;
        do {
          pcVar4 = fgets(acStack_4029 + sVar3 + 1,0x2000 - (int)sVar3,__stream);
          if (pcVar4 == (char *)0x0) break;
          sVar3 = strlen(acStack_4029 + 1);
        } while (sVar3 < 0x1fff);
        uVar2 = pclose(__stream);
        if (uVar2 != 0) {
          fprintf(_stderr,"Error running command \'%s\' (exit %d): %s\n",command,(ulong)uVar2,
                  acStack_4029 + 1);
        }
        if (output == (char **)0x0) {
          return uVar2;
        }
        sVar3 = strlen(acStack_4029 + 1);
        if (sVar3 != 0) {
          ppuVar5 = __ctype_b_loc();
          bVar1 = *(byte *)((long)*ppuVar5 + (long)(acStack_4029 + 1)[sVar3 - 1] * 2 + 1);
          while ((bVar1 & 0x20) != 0) {
            acStack_4029[sVar3] = '\0';
            bVar1 = *(byte *)((long)*ppuVar5 + 1);
          }
        }
        pcVar4 = strdup(acStack_4029 + 1);
        *output = pcVar4;
        return uVar2;
      }
      pcVar4 = "Unable to execute command \'%s\'\n";
    }
  }
  else {
    pcVar4 = "Unable to format command (%s)\n";
  }
  fprintf(_stderr,pcVar4,command);
  return -1;
}

Assistant:

static int run_command(char **output, const char *command, ...)
{
    va_list args;
    int ret;

    va_start(args, command);
    ret = run_command_varg(output, command, args);
    va_end(args);

    return ret;
}